

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.hpp
# Opt level: O0

void __thiscall cov::error::~error(error *this)

{
  exception *in_RDI;
  
  std::__cxx11::string::~string((string *)(in_RDI + 8));
  std::exception::~exception(in_RDI);
  return;
}

Assistant:

~error() override = default;